

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,char c)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  sc_string_rep *r;
  char *__dest;
  int iVar6;
  char in_DL;
  undefined7 in_register_00000031;
  
  lVar1 = *(long *)CONCAT71(in_register_00000031,c);
  sVar5 = strlen(*(char **)(lVar1 + 8));
  r = (sc_string_rep *)operator_new(0x10);
  iVar2 = (int)sVar5;
  uVar3 = iVar2 + 0x10;
  if (-1 < (int)(iVar2 + 1U)) {
    uVar3 = iVar2 + 1U;
  }
  r->ref_count = 1;
  iVar6 = (uVar3 & 0xfffffff0) + 0x10;
  r->alloc = iVar6;
  iVar4 = -1;
  if (-1 < iVar6) {
    iVar4 = iVar6;
  }
  __dest = (char *)operator_new__((long)iVar4);
  r->str = __dest;
  *__dest = '\0';
  strcpy(__dest,*(char **)(lVar1 + 8));
  __dest[iVar2] = in_DL;
  __dest[(long)iVar2 + 1] = '\0';
  sc_string_old(this,r);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old sc_string_old::operator+(char c) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + 2 );
    strcpy( r->str, rep->str );
    r->str[len] = c;
    r->str[len+1] = 00;
    return sc_string_old(r);
}